

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_append(char *dst,char *src,int dst_size)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (dst_size < 1) {
    dbg_msg("assert","%s(%d): %s",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
            ,0x823,"dst_size invalid");
    _DAT_00000000 = 0;
  }
  sVar2 = strlen(dst);
  iVar1 = (int)sVar2;
  if (dst_size - iVar1 != 0 && iVar1 <= dst_size) {
    uVar3 = 0;
    do {
      dst[uVar3 + (long)iVar1] = src[uVar3];
      if (src[uVar3] == '\0') break;
      uVar3 = uVar3 + 1;
    } while ((uint)(dst_size - iVar1) != uVar3);
  }
  dst[(long)dst_size + -1] = '\0';
  return;
}

Assistant:

void str_append(char *dst, const char *src, int dst_size)
{
	int s;
	int i = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");
	s = str_length(dst);
	while(s < dst_size)
	{
		dst[s] = src[i];
		if(!src[i]) /* check for null termination */
			break;
		s++;
		i++;
	}

	dst[dst_size-1] = 0; /* assure null termination */
}